

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

uchar * print(cJSON *item,cJSON_bool format,internal_hooks *hooks)

{
  cJSON_bool cVar1;
  uchar *__dest;
  ulong __n;
  long in_FS_OFFSET;
  printbuffer local_58;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.noalloc = 0;
  local_58.format = 0;
  local_58.hooks.allocate = (_func_void_ptr_size_t *)0x0;
  local_58.offset = 0;
  local_58.depth = 0;
  local_58.buffer = (uchar *)0x0;
  local_58.length = 0;
  local_58.buffer = (uchar *)(*global_hooks.allocate)(0x100);
  local_58.format = format;
  local_58.hooks.allocate = global_hooks.allocate;
  local_58.hooks.deallocate = global_hooks.deallocate;
  local_58.hooks.reallocate = global_hooks.reallocate;
  if (local_58.buffer != (uchar *)0x0) {
    cVar1 = print_value(item,&local_58);
    if (cVar1 != 0) {
      update_offset(&local_58);
      if (global_hooks.reallocate != (_func_void_ptr_void_ptr_size_t *)0x0) {
        __dest = (uchar *)(*global_hooks.reallocate)(local_58.buffer,local_58.length);
        goto LAB_0010296e;
      }
      __dest = (uchar *)(*global_hooks.allocate)(local_58.offset + 1);
      if (__dest != (uchar *)0x0) {
        __n = local_58.offset + 1;
        if (local_58.length < local_58.offset + 1) {
          __n = local_58.length;
        }
        memcpy(__dest,local_58.buffer,__n);
        __dest[local_58.offset] = '\0';
        (*global_hooks.deallocate)(local_58.buffer);
        goto LAB_0010296e;
      }
    }
    if (local_58.buffer != (uchar *)0x0) {
      (*global_hooks.deallocate)(local_58.buffer);
    }
  }
  __dest = (uchar *)0x0;
LAB_0010296e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return __dest;
}

Assistant:

static unsigned char *print(const cJSON * const item, cJSON_bool format, const internal_hooks * const hooks)
{
    printbuffer buffer[1];
    unsigned char *printed = NULL;

    memset(buffer, 0, sizeof(buffer));

    /* create buffer */
    buffer->buffer = (unsigned char*) hooks->allocate(256);
    buffer->format = format;
    buffer->hooks = *hooks;
    if (buffer->buffer == NULL)
    {
        goto fail;
    }

    /* print the value */
    if (!print_value(item, buffer))
    {
        goto fail;
    }
    update_offset(buffer);

    /* check if reallocate is available */
    if (hooks->reallocate != NULL)
    {
        printed = (unsigned char*) hooks->reallocate(buffer->buffer, buffer->length);
        buffer->buffer = NULL;
        if (printed == NULL) {
            goto fail;
        }
    }
    else /* otherwise copy the JSON over to a new buffer */
    {
        printed = (unsigned char*) hooks->allocate(buffer->offset + 1);
        if (printed == NULL)
        {
            goto fail;
        }
        memcpy(printed, buffer->buffer, cjson_min(buffer->length, buffer->offset + 1));
        printed[buffer->offset] = '\0'; /* just to be sure */

        /* free the buffer */
        hooks->deallocate(buffer->buffer);
    }

    return printed;

fail:
    if (buffer->buffer != NULL)
    {
        hooks->deallocate(buffer->buffer);
    }

    if (printed != NULL)
    {
        hooks->deallocate(printed);
    }

    return NULL;
}